

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::compute::anon_unknown_0::BufferToBufferInvertTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferToBufferInvertTestInstance *this)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  TestStatus *pTVar1;
  Allocation *pAVar2;
  undefined8 obj;
  undefined8 commandBuffer;
  undefined8 uVar3;
  pointer pWVar4;
  VkDescriptorPool VVar5;
  deUint32 queueFamilyIndex;
  deUint32 dVar6;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *pDVar7;
  DescriptorPoolBuilder *pDVar8;
  DescriptorSetUpdateBuilder *pDVar9;
  const_iterator cVar10;
  ostream *poVar11;
  deUint32 *pdVar12;
  VkDeviceSize bufferSize;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  VkBufferMemoryBarrier hostWriteBarrier;
  long local_398;
  long *plStack_390;
  pointer local_388;
  VkAllocationCallbacks *pVStack_380;
  TestStatus *local_370;
  VkQueue local_368;
  Allocator *local_360;
  VkPipelineLayout local_358;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_350;
  VkDescriptorSetLayout local_338;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_330;
  long *local_318;
  long local_310;
  long local_308 [2];
  Buffer inputBuffer;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_2c0;
  VkPipeline local_2a8;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_2a0;
  VkShaderModule local_288;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_280;
  VkDescriptorPool local_268;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_260;
  Buffer outputBuffer;
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  VkDescriptorBufferInfo inputBufferDescriptorInfo;
  Random rnd;
  pointer local_1d8;
  VkDescriptorPool VStack_1d0;
  pointer local_1c0;
  pointer local_1b8;
  pointer local_1a8;
  ios_base local_178 [272];
  VkBufferMemoryBarrier shaderWriteBarrier;
  
  local_370 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_368 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_360 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  bVar15 = this->m_bufferType == BUFFER_TYPE_UNIFORM;
  dVar6 = 0x124fef;
  if (bVar15) {
    dVar6 = 0x111223f;
  }
  bufferSize = (ulong)this->m_numValues << 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,(uint)!bVar15 * 0x10 + 0x10);
  compute::Buffer::Buffer
            (&inputBuffer,vk,device,local_360,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  deRandom_init(&rnd.m_rnd,dVar6);
  pAVar2 = inputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (this->m_numValues != 0) {
    pdVar12 = (deUint32 *)
              (inputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
              m_hostPtr;
    uVar14 = 0;
    do {
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      *pdVar12 = dVar6;
      uVar14 = uVar14 + 1;
      pdVar12 = pdVar12 + 4;
    } while (uVar14 < this->m_numValues);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,bufferSize);
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,0x20);
  compute::Buffer::Buffer
            (&outputBuffer,vk,device,local_360,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  pDVar7 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     ((DescriptorSetLayoutBuilder *)&rnd,bVar15 ^ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      1,0x20,(VkSampler *)0x0);
  pDVar7 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar7,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&hostWriteBarrier,pDVar7,vk,device,0);
  DStack_330.m_device = (VkDevice)hostWriteBarrier._16_8_;
  DStack_330.m_allocator = (VkAllocationCallbacks *)hostWriteBarrier._24_8_;
  local_338.m_internal = hostWriteBarrier._0_8_;
  DStack_330.m_deviceIface = (DeviceInterface *)hostWriteBarrier.pNext;
  hostWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  hostWriteBarrier._4_4_ = 0;
  hostWriteBarrier.pNext = (void *)0x0;
  hostWriteBarrier.srcAccessMask = 0;
  hostWriteBarrier.dstAccessMask = 0;
  hostWriteBarrier.srcQueueFamilyIndex = 0;
  hostWriteBarrier.dstQueueFamilyIndex = 0;
  if (local_1b8 != (pointer)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  if ((VkAllocationCallbacks *)VStack_1d0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_1d0.m_internal,(long)local_1c0 - VStack_1d0.m_internal);
  }
  if (rnd.m_rnd._0_8_ != 0) {
    operator_delete((void *)rnd.m_rnd._0_8_,(long)local_1d8 - rnd.m_rnd._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&hostWriteBarrier);
  pDVar8 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&hostWriteBarrier,
                      bVar15 ^ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar8 = ::vk::DescriptorPoolBuilder::addType(pDVar8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&rnd,pDVar8,vk,device,1,1);
  DStack_260.m_device = (VkDevice)local_1d8;
  DStack_260.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  local_268.m_internal._0_4_ = rnd.m_rnd.x;
  local_268.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_260.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_1d8 = (pointer)0x0;
  VStack_1d0.m_internal = 0;
  if (hostWriteBarrier._0_8_ != 0) {
    operator_delete((void *)hostWriteBarrier._0_8_,hostWriteBarrier._16_8_ - hostWriteBarrier._0_8_)
    ;
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&rnd,vk,device,local_268,local_338);
  local_388 = local_1d8;
  pVStack_380 = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  local_398._0_4_ = rnd.m_rnd.x;
  local_398._4_4_ = rnd.m_rnd.y;
  plStack_390 = (long *)rnd.m_rnd._8_8_;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  pDVar9 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write
                     ((DescriptorSetUpdateBuilder *)&rnd,(int)local_398,(void *)0x0,0);
  pDVar9 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write(pDVar9,(int)local_398,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar9,vk,device);
  if (local_1b8 != (pointer)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  if ((VkAllocationCallbacks *)VStack_1d0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_1d0.m_internal,(long)local_1c0 - VStack_1d0.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&rnd);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  hostWriteBarrier._0_8_ = &hostWriteBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hostWriteBarrier,"comp","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&hostWriteBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&rnd,vk,device,
             *(ProgramBinary **)(cVar10._M_node + 2),0);
  DStack_280.m_device = (VkDevice)local_1d8;
  DStack_280.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  local_288.m_internal._0_4_ = rnd.m_rnd.x;
  local_288.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_280.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_1d8 = (pointer)0x0;
  VStack_1d0.m_internal = 0;
  if ((VkAccessFlags *)hostWriteBarrier._0_8_ != &hostWriteBarrier.srcAccessMask) {
    operator_delete((void *)hostWriteBarrier._0_8_,hostWriteBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rnd,vk,device,local_338);
  DStack_350.m_device = (VkDevice)local_1d8;
  DStack_350.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  local_358.m_internal._0_4_ = rnd.m_rnd.x;
  local_358.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_350.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,vk,device,
                      (VkPipelineLayout)rnd.m_rnd._0_8_,local_288);
  DStack_2a0.m_device = (VkDevice)local_1d8;
  DStack_2a0.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  local_2a8.m_internal._0_4_ = rnd.m_rnd.x;
  local_2a8.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_2a0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeBufferMemoryBarrier
            (&hostWriteBarrier,0x4000,0x20,
             (VkBuffer)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeBufferMemoryBarrier
            (&shaderWriteBarrier,0x40,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&rnd,vk,device,queueFamilyIndex);
  obj = rnd.m_rnd._0_8_;
  DStack_2c0.m_device = (VkDevice)local_1d8;
  DStack_2c0.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  DStack_2c0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&rnd,vk,device,(VkCommandPool)rnd.m_rnd._0_8_,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar5.m_internal = VStack_1d0.m_internal;
  pWVar4 = local_1d8;
  uVar3 = rnd.m_rnd._8_8_;
  commandBuffer = rnd.m_rnd._0_8_;
  beginCommandBuffer(vk,(VkCommandBuffer)rnd.m_rnd._0_8_);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_2a8.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,1,local_358.m_internal,0,1,&local_398,0,0);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x4000,0x800,0,0,0,1,&hostWriteBarrier,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,commandBuffer,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1],(ulong)(uint)(this->m_workSize).m_data[2]);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x800,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(vk,device,local_368,(VkCommandBuffer)commandBuffer);
  pAVar2 = outputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  pTVar1 = local_370;
  if (this->m_numValues != 0) {
    lVar13 = 0;
    dVar6 = 0;
    do {
      if ((*(uint *)((long)(inputBuffer.m_allocation.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.ptr)->m_hostPtr + lVar13) ^
          *(uint *)((long)pAVar2->m_hostPtr + lVar13)) != 0xffffffff) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&rnd,"Comparison failed for Output.values[",0x24);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&rnd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
        std::__cxx11::stringbuf::str();
        pTVar1->m_code = QP_TEST_RESULT_FAIL;
        (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar1->m_description,local_318,local_310 + (long)local_318);
        if (local_318 != local_308) {
          operator_delete(local_318,local_308[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
        std::ios_base::~ios_base(local_178);
        goto LAB_007028d5;
      }
      dVar6 = dVar6 + 1;
      lVar13 = lVar13 + 0x10;
    } while (this->m_numValues != dVar6);
  }
  rnd.m_rnd._0_8_ = &local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"Compute succeeded","");
  pTVar1->m_code = QP_TEST_RESULT_PASS;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,rnd.m_rnd._0_8_,rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  if ((pointer *)rnd.m_rnd._0_8_ != &local_1d8) {
    operator_delete((void *)rnd.m_rnd._0_8_,
                    (ulong)((long)&(local_1d8->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_007028d5:
  if (commandBuffer != 0) {
    rnd.m_rnd._0_8_ = commandBuffer;
    (**(code **)(*(long *)uVar3 + 0x240))(uVar3,pWVar4,VVar5.m_internal,1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_2c0,(VkCommandPool)obj);
  }
  if (local_2a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_2a0,local_2a8);
  }
  if (local_358.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_350,local_358);
  }
  if (local_288.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_280,local_288);
  }
  if (local_398 != 0) {
    rnd.m_rnd.x = (undefined4)local_398;
    rnd.m_rnd.y = local_398._4_4_;
    (**(code **)(*plStack_390 + 0x1e8))(plStack_390,local_388,pVStack_380,1);
  }
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_260,local_268);
  }
  if (local_338.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_330,local_338);
  }
  if (outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (outputBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(outputBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    outputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (inputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(inputBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus BufferToBufferInvertTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Customize the test based on buffer type

	const VkBufferUsageFlags inputBufferUsageFlags		= (m_bufferType == BUFFER_TYPE_UNIFORM ? VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT : VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	const VkDescriptorType inputBufferDescriptorType	= (m_bufferType == BUFFER_TYPE_UNIFORM ? VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER : VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
	const deUint32 randomSeed							= (m_bufferType == BUFFER_TYPE_UNIFORM ? 0x111223f : 0x124fef);

	// Create an input buffer

	const VkDeviceSize bufferSizeBytes = sizeof(tcu::UVec4) * m_numValues;
	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, inputBufferUsageFlags), MemoryRequirement::HostVisible);

	// Fill the input buffer with data
	{
		de::Random rnd(randomSeed);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		tcu::UVec4* bufferPtr = static_cast<tcu::UVec4*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < m_numValues; ++i)
			bufferPtr[i].x() = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), bufferSizeBytes);
	}

	// Create an output buffer

	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(inputBufferDescriptorType, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(inputBufferDescriptorType)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo inputBufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, bufferSizeBytes);
	const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, bufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), inputBufferDescriptorType, &inputBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const VkBufferMemoryBarrier hostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, bufferSizeBytes);

	const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, bufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &hostWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &shaderWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), bufferSizeBytes);

	const tcu::UVec4* bufferPtr = static_cast<tcu::UVec4*>(outputBufferAllocation.getHostPtr());
	const tcu::UVec4* refBufferPtr = static_cast<tcu::UVec4*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 ndx = 0; ndx < m_numValues; ++ndx)
	{
		const deUint32 res = bufferPtr[ndx].x();
		const deUint32 ref = ~refBufferPtr[ndx].x();

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for Output.values[" << ndx << "]";
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}